

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

void cmsys::SystemTools::ClassInitialize(void)

{
  size_type __n;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  int *piVar5;
  char *pcVar6;
  string pwd_path;
  string cwd_str;
  string pwd_str;
  string pwd_changed;
  string cwd_changed;
  char resolved_name [4096];
  char buf [2048];
  allocator<char> local_18f9;
  long *local_18f8 [2];
  long local_18e8 [2];
  undefined1 *local_18d8;
  char *local_18d0;
  undefined1 local_18c8;
  undefined7 uStack_18c7;
  string local_18b8;
  string local_1898;
  string local_1878;
  string local_1858;
  string local_1838 [128];
  char local_838 [2056];
  
  Statics = operator_new(0x30);
  *(undefined4 *)((long)Statics + 8) = 0;
  *(undefined8 *)((long)Statics + 0x10) = 0;
  *(long *)((long)Statics + 0x18) = (long)Statics + 8;
  *(long *)((long)Statics + 0x20) = (long)Statics + 8;
  *(undefined8 *)((long)Statics + 0x28) = 0;
  local_1838[0]._M_dataplus._M_p = (pointer)&local_1838[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1838,"/tmp/","");
  AddKeepPath(local_1838);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1838[0]._M_dataplus._M_p != &local_1838[0].field_2) {
    operator_delete(local_1838[0]._M_dataplus._M_p,local_1838[0].field_2._M_allocated_capacity + 1);
  }
  local_1898._M_dataplus._M_p = (pointer)&local_1898.field_2;
  local_1898._M_string_length = 0;
  local_1898.field_2._M_local_buf[0] = '\0';
  bVar1 = GetEnv("PWD",&local_1898);
  if (bVar1) {
    pcVar3 = getcwd(local_838,0x800);
    if (pcVar3 != (char *)0x0) {
      local_1858._M_dataplus._M_p = (pointer)&local_1858.field_2;
      local_1858._M_string_length = 0;
      local_1858.field_2._M_local_buf[0] = '\0';
      local_1878._M_dataplus._M_p = (pointer)&local_1878.field_2;
      local_1878._M_string_length = 0;
      local_1878.field_2._M_local_buf[0] = '\0';
      local_18b8._M_dataplus._M_p = (pointer)&local_18b8.field_2;
      sVar4 = strlen(pcVar3);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_18b8,pcVar3,pcVar3 + sVar4);
      local_18d8 = &local_18c8;
      local_18d0 = (char *)0x0;
      local_18c8 = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_18f8,local_1898._M_dataplus._M_p,&local_18f9);
      piVar5 = __errno_location();
      *piVar5 = 0;
      pcVar6 = realpath((char *)local_18f8[0],(char *)local_1838);
      pcVar3 = local_18d0;
      if (pcVar6 == (char *)0x0) {
        std::__cxx11::string::_M_assign((string *)&local_18d8);
      }
      else {
        strlen(pcVar6);
        std::__cxx11::string::_M_replace((ulong)&local_18d8,0,pcVar3,(ulong)pcVar6);
      }
      if (local_18f8[0] != local_18e8) {
        operator_delete(local_18f8[0],local_18e8[0] + 1);
      }
      if ((char *)local_18b8._M_string_length == local_18d0) {
        do {
          __n = local_18b8._M_string_length;
          if ((char *)local_18b8._M_string_length != (char *)0x0) {
            iVar2 = bcmp(local_18b8._M_dataplus._M_p,local_18d8,local_18b8._M_string_length);
            if (iVar2 != 0) break;
          }
          if (__n == local_1898._M_string_length) {
            if ((char *)__n == (char *)0x0) break;
            iVar2 = bcmp(local_18b8._M_dataplus._M_p,local_1898._M_dataplus._M_p,__n);
            if (iVar2 == 0) break;
          }
          std::__cxx11::string::_M_assign((string *)&local_1858);
          std::__cxx11::string::_M_assign((string *)&local_1878);
          GetFilenamePath(local_1838,&local_1898);
          std::__cxx11::string::operator=((string *)&local_1898,(string *)local_1838);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1838[0]._M_dataplus._M_p != &local_1838[0].field_2) {
            operator_delete(local_1838[0]._M_dataplus._M_p,
                            local_1838[0].field_2._M_allocated_capacity + 1);
          }
          GetFilenamePath(local_1838,&local_18b8);
          std::__cxx11::string::operator=((string *)&local_18b8,(string *)local_1838);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1838[0]._M_dataplus._M_p != &local_1838[0].field_2) {
            operator_delete(local_1838[0]._M_dataplus._M_p,
                            local_1838[0].field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_18f8,local_1898._M_dataplus._M_p,&local_18f9);
          *piVar5 = 0;
          pcVar6 = realpath((char *)local_18f8[0],(char *)local_1838);
          pcVar3 = local_18d0;
          if (pcVar6 == (char *)0x0) {
            std::__cxx11::string::_M_assign((string *)&local_18d8);
          }
          else {
            strlen(pcVar6);
            std::__cxx11::string::_M_replace((ulong)&local_18d8,0,pcVar3,(ulong)pcVar6);
          }
          if (local_18f8[0] != local_18e8) {
            operator_delete(local_18f8[0],local_18e8[0] + 1);
          }
        } while ((char *)local_18b8._M_string_length == local_18d0);
      }
      if ((local_1858._M_string_length != 0) && (local_1878._M_string_length != 0)) {
        AddTranslationPath(&local_1858,&local_1878);
      }
      if (local_18d8 != &local_18c8) {
        operator_delete(local_18d8,CONCAT71(uStack_18c7,local_18c8) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_18b8._M_dataplus._M_p != &local_18b8.field_2) {
        operator_delete(local_18b8._M_dataplus._M_p,local_18b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1878._M_dataplus._M_p != &local_1878.field_2) {
        operator_delete(local_1878._M_dataplus._M_p,
                        CONCAT71(local_1878.field_2._M_allocated_capacity._1_7_,
                                 local_1878.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1858._M_dataplus._M_p != &local_1858.field_2) {
        operator_delete(local_1858._M_dataplus._M_p,
                        CONCAT71(local_1858.field_2._M_allocated_capacity._1_7_,
                                 local_1858.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1898._M_dataplus._M_p != &local_1898.field_2) {
    operator_delete(local_1898._M_dataplus._M_p,
                    CONCAT71(local_1898.field_2._M_allocated_capacity._1_7_,
                             local_1898.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void SystemTools::ClassInitialize()
{
#ifdef __VMS
  SetVMSFeature("DECC$FILENAME_UNIX_ONLY", 1);
#endif

  // Create statics singleton instance
  SystemTools::Statics = new SystemToolsStatic;

#if KWSYS_SYSTEMTOOLS_USE_TRANSLATION_MAP
// Add some special translation paths for unix.  These are not added
// for windows because drive letters need to be maintained.  Also,
// there are not sym-links and mount points on windows anyway.
#  if !defined(_WIN32) || defined(__CYGWIN__)
  // The tmp path is frequently a logical path so always keep it:
  SystemTools::AddKeepPath("/tmp/");

  // If the current working directory is a logical path then keep the
  // logical name.
  std::string pwd_str;
  if (SystemTools::GetEnv("PWD", pwd_str)) {
    char buf[2048];
    if (const char* cwd = Getcwd(buf, 2048)) {
      // The current working directory may be a logical path.  Find
      // the shortest logical path that still produces the correct
      // physical path.
      std::string cwd_changed;
      std::string pwd_changed;

      // Test progressively shorter logical-to-physical mappings.
      std::string cwd_str = cwd;
      std::string pwd_path;
      Realpath(pwd_str.c_str(), pwd_path);
      while (cwd_str == pwd_path && cwd_str != pwd_str) {
        // The current pair of paths is a working logical mapping.
        cwd_changed = cwd_str;
        pwd_changed = pwd_str;

        // Strip off one directory level and see if the logical
        // mapping still works.
        pwd_str = SystemTools::GetFilenamePath(pwd_str);
        cwd_str = SystemTools::GetFilenamePath(cwd_str);
        Realpath(pwd_str.c_str(), pwd_path);
      }

      // Add the translation to keep the logical path name.
      if (!cwd_changed.empty() && !pwd_changed.empty()) {
        SystemTools::AddTranslationPath(cwd_changed, pwd_changed);
      }
    }
  }
#  endif
#endif
}